

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.h
# Opt level: O2

uint64_t __thiscall
basisu::pvrtc4_image::map_pixel
          (pvrtc4_image *this,uint32_t x,uint32_t y,color_rgba *c,bool perceptual,
          bool alpha_is_significant,bool record)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  color_rgba *e2;
  ulong uVar4;
  long lVar5;
  color_rgba v [4];
  
  get_interpolated_colors(this,x,y,v);
  uVar1 = color_distance(perceptual,c,v,alpha_is_significant);
  uVar4 = (ulong)uVar1;
  uVar1 = 0;
  e2 = v;
  for (lVar5 = -3; e2 = e2 + 1, lVar5 != 0; lVar5 = lVar5 + 1) {
    uVar2 = color_distance(perceptual,c,e2,alpha_is_significant);
    uVar3 = (ulong)uVar2;
    if (uVar3 < uVar4) {
      uVar1 = (int)lVar5 + 4;
    }
    if (uVar3 <= uVar4) {
      uVar4 = uVar3;
    }
  }
  if (record) {
    set_modulation(this,x,y,uVar1);
  }
  return uVar4;
}

Assistant:

inline uint64_t map_pixel(uint32_t x, uint32_t y, const color_rgba& c, bool perceptual, bool alpha_is_significant, bool record = true)
		{
			color_rgba v[4];
			get_interpolated_colors(x, y, v);

			uint64_t best_dist = color_distance(perceptual, c, v[0], alpha_is_significant);
			uint32_t best_v = 0;
			for (uint32_t i = 1; i < 4; i++)
			{
				uint64_t dist = color_distance(perceptual, c, v[i], alpha_is_significant);
				if (dist < best_dist)
				{
					best_dist = dist;
					best_v = i;
				}
			}

			if (record)
				set_modulation(x, y, best_v);

			return best_dist;
		}